

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnFunction(BinaryReaderIR *this,Index index,Index sig_index)

{
  char *pcVar1;
  Offset OVar2;
  FuncType *pFVar3;
  FuncModuleField *pFVar4;
  undefined1 local_b0 [8];
  Location loc_1;
  Location loc;
  FuncModuleField *local_40;
  _Head_base<0UL,_wabt::FuncModuleField_*,_false> local_38;
  
  pcVar1 = this->filename_;
  strlen(pcVar1);
  loc_1.field_1._8_8_ = pcVar1;
  MakeUnique<wabt::FuncModuleField,wabt::Location>
            ((wabt *)&local_40,(Location *)((long)&loc_1.field_1 + 8));
  pFVar4 = local_40;
  (local_40->func).decl.has_func_type = true;
  pcVar1 = this->filename_;
  OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.line = 0;
  loc_1.filename.data_ = (char *)strlen(pcVar1);
  local_b0 = (undefined1  [8])pcVar1;
  loc_1.filename.size_ = OVar2;
  Var::Var((Var *)((long)&loc_1.field_1 + 8),sig_index,(Location *)local_b0);
  Var::operator=(&(pFVar4->func).decl.type_var,(Var *)((long)&loc_1.field_1 + 8));
  Var::~Var((Var *)((long)&loc_1.field_1 + 8));
  pFVar3 = (this->module_->func_types).
           super__Vector_base<wabt::FuncType_*,_std::allocator<wabt::FuncType_*>_>._M_impl.
           super__Vector_impl_data._M_start[sig_index];
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            (&(pFVar4->func).decl.sig.param_types,&(pFVar3->sig).param_types);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator=
            (&(pFVar4->func).decl.sig.result_types,&(pFVar3->sig).result_types);
  local_38._M_head_impl = local_40;
  local_40 = (FuncModuleField *)0x0;
  Module::AppendField(this->module_,
                      (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&local_38);
  if (local_38._M_head_impl != (FuncModuleField *)0x0) {
    (*((local_38._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)0>).super_ModuleField.
      _vptr_ModuleField[1])();
  }
  local_38._M_head_impl = (FuncModuleField *)0x0;
  if (local_40 != (FuncModuleField *)0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnFunction(Index index, Index sig_index) {
  auto field = MakeUnique<FuncModuleField>(GetLocation());
  Func& func = field->func;
  func.decl.has_func_type = true;
  func.decl.type_var = Var(sig_index, GetLocation());
  func.decl.sig = module_->func_types[sig_index]->sig;
  module_->AppendField(std::move(field));
  return Result::Ok;
}